

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O0

ArrowSchemaMetadata *
duckdb::ArrowSchemaMetadata::NonCanonicalType(string *type_name,string *vendor_name)

{
  pointer this;
  type complex_json;
  ArrowSchemaMetadata *in_RDI;
  ArrowSchemaMetadata *metadata;
  string *in_stack_fffffffffffffe90;
  string *value;
  string *in_stack_fffffffffffffe98;
  string *key;
  ComplexJSON *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ArrowSchemaMetadata *in_stack_fffffffffffffeb0;
  string local_128 [39];
  undefined1 local_101 [48];
  undefined1 local_d1 [48];
  undefined1 local_a1 [40];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  
  local_19 = 0;
  ArrowSchemaMetadata(in_stack_fffffffffffffeb0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,"ARROW:extension:name",&local_41);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_78,"arrow.opaque",&local_79);
  AddOption((ArrowSchemaMetadata *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
            in_stack_fffffffffffffe90);
  ::std::__cxx11::string::~string(local_78);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ::std::__cxx11::string::~string(local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::operator->
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *)
             in_stack_fffffffffffffe90);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_a1 + 1),"vendor_name",(allocator *)args);
  make_uniq<duckdb::ComplexJSON,std::__cxx11::string_const&>(args);
  ComplexJSON::AddObject
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *)
             in_stack_fffffffffffffe90);
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *)
             0x1524895);
  ::std::__cxx11::string::~string((string *)(local_a1 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_a1);
  this = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::operator->
                   ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                     *)in_stack_fffffffffffffe90);
  key = (string *)local_d1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_d1 + 1),"type_name",(allocator *)key);
  make_uniq<duckdb::ComplexJSON,std::__cxx11::string_const&>(args);
  ComplexJSON::AddObject
            (this,key,(unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                       *)in_stack_fffffffffffffe90);
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *)
             0x1524931);
  ::std::__cxx11::string::~string((string *)(local_d1 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_d1);
  value = (string *)local_101;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_101 + 1),"ARROW:extension:metadata",(allocator *)value);
  complex_json = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
                 operator*((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                            *)value);
  StringUtil::ToComplexJSONMap_abi_cxx11_(complex_json);
  AddOption((ArrowSchemaMetadata *)this,key,value);
  ::std::__cxx11::string::~string(local_128);
  ::std::__cxx11::string::~string((string *)(local_101 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_101);
  return in_RDI;
}

Assistant:

ArrowSchemaMetadata ArrowSchemaMetadata::NonCanonicalType(const string &type_name, const string &vendor_name) {
	ArrowSchemaMetadata metadata;
	metadata.AddOption(ARROW_EXTENSION_NAME, ArrowExtensionMetadata::ARROW_EXTENSION_NON_CANONICAL);
	// We have to set the metadata key with type_name and vendor_name.
	metadata.extension_metadata_map->AddObject("vendor_name", make_uniq<ComplexJSON>(vendor_name));
	metadata.extension_metadata_map->AddObject("type_name", make_uniq<ComplexJSON>(type_name));
	metadata.AddOption(ARROW_METADATA_KEY, StringUtil::ToComplexJSONMap(*metadata.extension_metadata_map));
	return metadata;
}